

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void handle_D_option(char *z)

{
  char **ppcVar1;
  size_t sVar2;
  char *__dest;
  long lVar3;
  
  lVar3 = (long)nDefine;
  nDefine = nDefine + 1;
  ppcVar1 = (char **)realloc(azDefine,lVar3 * 8 + 8);
  azDefine = ppcVar1;
  if (ppcVar1 != (char **)0x0) {
    sVar2 = strlen(z);
    __dest = (char *)malloc((long)((int)sVar2 + 1));
    ppcVar1[lVar3] = __dest;
    if (__dest != (char *)0x0) {
      strcpy(__dest,z);
      for (; (*__dest != '\0' && (*__dest != '=')); __dest = __dest + 1) {
      }
      *__dest = '\0';
      return;
    }
  }
  fwrite("out of memory\n",0xe,1,_stderr);
  exit(1);
}

Assistant:

static void handle_D_option(char *z){
  char **paz;
  nDefine++;
  azDefine = (char **) realloc(azDefine, sizeof(azDefine[0])*nDefine);
  if( azDefine==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  paz = &azDefine[nDefine-1];
  *paz = (char *) malloc( lemonStrlen(z)+1 );
  if( *paz==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  strcpy(*paz, z);
  for(z=*paz; *z && *z!='='; z++){}
  *z = 0;
}